

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osnetunix.cpp
# Opt level: O3

int OS_HttpClient::request
              (int opts,char *host,unsigned_short portno,char *verb,char *resource,
              char *send_headers,size_t send_headers_len,OS_HttpPayload *payload,
              CVmDataSource *reply,char **headers,char **location,char *ua)

{
  char cVar1;
  char *pcVar2;
  CVmDataSource *pCVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  CVmMemorySource *this;
  OS_HttpPayloadItem *pOVar8;
  short *psVar10;
  char *pcVar11;
  long lVar12;
  long lVar13;
  int n;
  char *pcVar14;
  undefined8 uVar15;
  short *psVar16;
  ulong uVar17;
  long lVar18;
  curl_httppost *formhead;
  curl_httppost *formtail;
  char *local_50;
  size_t formlen;
  char *l;
  long http_stat;
  curl_httppost *pcVar9;
  undefined4 extraout_var;
  
  formlen = 0;
  formhead = (curl_httppost *)0x0;
  formtail = (curl_httppost *)0x0;
  if (location != (char **)0x0) {
    *location = (char *)0x0;
  }
  if (headers != (char **)0x0) {
    *headers = (char *)0x0;
  }
  lVar7 = curl_easy_init();
  if (lVar7 == 0) {
    iVar4 = -100;
    this = (CVmMemorySource *)0x0;
    lVar12 = 0;
    goto LAB_001fe673;
  }
  pcVar14 = "https";
  if ((opts & 1U) == 0) {
    pcVar14 = "http";
  }
  this = (CVmMemorySource *)0x0;
  local_50 = t3sprintf_alloc("%s://%s:%d%s",pcVar14,host,portno,resource);
  curl_easy_setopt(lVar7,0x2712,local_50);
  curl_easy_setopt(lVar7,0x2b,1);
  curl_easy_setopt(lVar7,99,1);
  curl_easy_setopt(lVar7,0x4e2b,http_get_recv);
  curl_easy_setopt(lVar7,0x2711,reply);
  if (headers != (char **)0x0) {
    this = (CVmMemorySource *)operator_new(0x10);
    CVmMemorySource::CVmMemorySource(this,0x400);
    curl_easy_setopt(lVar7,0x4e6f,http_get_hdr);
    curl_easy_setopt(lVar7,0x272d,this);
  }
  if ((ua != (char *)0x0) && (*ua != '\0')) {
    curl_easy_setopt(lVar7,0x2722);
  }
  iVar4 = stricmp(verb,"GET");
  if (iVar4 == 0) {
    pcVar14 = (char *)0x0;
  }
  else {
    iVar4 = stricmp(verb,"POST");
    if ((payload == (OS_HttpPayload *)0x0) || (iVar4 != 0)) {
      iVar4 = stricmp(verb,"PUT");
      if ((payload == (OS_HttpPayload *)0x0) ||
         ((iVar4 != 0 || (iVar4 = OS_HttpPayload::count_items(payload), iVar4 != 1)))) {
        curl_easy_cleanup(lVar7);
        return -4;
      }
      curl_easy_setopt(lVar7,0x2e,1);
LAB_001fe42b:
      pcVar14 = (char *)0x0;
      pOVar8 = OS_HttpPayload::get(payload,0);
      pCVar3 = pOVar8->stream;
      curl_easy_setopt(lVar7,0x4e2c,http_get_send);
      curl_easy_setopt(lVar7,0x2719,pCVar3);
      uVar6 = (*pCVar3->_vptr_CVmDataSource[6])(pCVar3);
      pcVar9 = (curl_httppost *)(ulong)uVar6;
      uVar15 = 0xe;
    }
    else {
      iVar4 = OS_HttpPayload::count_items(payload);
      if ((iVar4 == 1) && (pOVar8 = OS_HttpPayload::get(payload,0), *pOVar8->name == '\0'))
      goto LAB_001fe42b;
      iVar4 = OS_HttpPayload::is_multipart(payload);
      if (iVar4 == 0) {
        pcVar14 = OS_HttpPayload::urlencode(payload,&formlen);
        curl_easy_setopt(lVar7,0x2f,1);
        curl_easy_setopt(lVar7,0x271f,pcVar14);
        uVar15 = 0x3c;
        pcVar9 = (curl_httppost *)formlen;
      }
      else {
        iVar4 = OS_HttpPayload::count_items(payload);
        if (0 < iVar4) {
          n = 0;
          do {
            pOVar8 = OS_HttpPayload::get(payload,n);
            pcVar14 = pOVar8->name;
            pcVar11 = pOVar8->val;
            if (pOVar8->stream == (CVmDataSource *)0x0) {
              iVar5 = curl_formadd(&formhead,&formtail,1,pcVar14,4,pcVar11,0x11);
              if (iVar5 != 0) goto LAB_001fe6c7;
            }
            else {
              pcVar2 = pOVar8->mime_type;
              iVar5 = (*pOVar8->stream->_vptr_CVmDataSource[6])();
              iVar5 = curl_formadd(&formhead,&formtail,1,pcVar14,0x10,pcVar11,0xe,pcVar2,6,iVar5,
                                   0x13,pOVar8->stream,0x11);
              if (iVar5 != 0) {
LAB_001fe6c7:
                pcVar14 = (char *)0x0;
                lVar12 = 0;
                lVar18 = 0xffffff9c;
                goto LAB_001fe64a;
              }
              curl_easy_setopt(lVar7,0x4e2c,http_get_send);
            }
            n = n + 1;
          } while (iVar4 != n);
        }
        pcVar14 = (char *)0x0;
        curl_easy_setopt(lVar7,0x2f,1);
        uVar15 = 0x2728;
        pcVar9 = formhead;
      }
    }
    curl_easy_setopt(lVar7,uVar15,pcVar9);
  }
  curl_easy_setopt(lVar7,0x34,location == (char **)0x0);
  if (send_headers == (char *)0x0) {
    lVar12 = 0;
  }
  else {
    lVar12 = 0;
    while (send_headers_len != 0) {
      psVar10 = (short *)((long)send_headers + send_headers_len);
      do {
        cVar1 = (char)*(short *)send_headers;
        if ((((cVar1 == '\n') || (cVar1 == '\r')) || (cVar1 < '\0')) ||
           (iVar4 = isspace((int)cVar1), iVar4 == 0)) goto LAB_001fe4f1;
        send_headers = (char *)((long)send_headers + 1);
        send_headers_len = send_headers_len - 1;
      } while (send_headers_len != 0);
      send_headers_len = 0;
      send_headers = (char *)psVar10;
LAB_001fe4f1:
      uVar17 = send_headers_len;
      for (psVar10 = (short *)send_headers;
          (uVar17 == 1 ||
          ((psVar16 = (short *)((long)send_headers + send_headers_len), uVar17 != 0 &&
           (psVar16 = psVar10, *psVar10 != 0xa0d)))); psVar10 = (short *)((long)psVar10 + 1)) {
        uVar17 = uVar17 - 1;
      }
      if ((long)psVar16 - (long)send_headers != 0) {
        pcVar11 = lib_copy_str(send_headers,(long)psVar16 - (long)send_headers);
        lVar12 = curl_slist_append(lVar12,pcVar11);
        lib_free_str(pcVar11);
      }
      send_headers = (char *)(psVar16 + (1 < uVar17));
      send_headers_len = uVar17 - 2;
      if (1 >= uVar17) {
        send_headers_len = uVar17;
      }
    }
    curl_easy_setopt(lVar7,0x2727,lVar12);
  }
  iVar4 = curl_easy_perform(lVar7);
  lVar18 = 0xffffff9c;
  if (iVar4 == 0) {
    curl_easy_getinfo(lVar7,0x200002,&http_stat);
    if (http_stat == 0x12d && location != (char **)0x0) {
      l = (char *)0x0;
      curl_easy_getinfo(lVar7,0x10001f,&l);
      pcVar11 = lib_copy_str(l);
      *location = pcVar11;
    }
    lVar18 = http_stat;
    if (headers != (char **)0x0) {
      iVar4 = (*(this->super_CVmDataSource)._vptr_CVmDataSource[6])(this);
      lVar13 = CONCAT44(extraout_var,iVar4);
      pcVar11 = (char *)operator_new__(lVar13 + 1);
      *headers = pcVar11;
      (*(this->super_CVmDataSource)._vptr_CVmDataSource[8])(this,0,0);
      (*(this->super_CVmDataSource)._vptr_CVmDataSource[2])(this,*headers,lVar13);
      (*headers)[lVar13] = '\0';
    }
  }
LAB_001fe64a:
  iVar4 = (int)lVar18;
  curl_easy_cleanup(lVar7);
  if (local_50 != (char *)0x0) {
    lib_free_str(local_50);
  }
  if (pcVar14 != (char *)0x0) {
    free(pcVar14);
  }
LAB_001fe673:
  if (formhead != (curl_httppost *)0x0) {
    curl_formfree();
  }
  if (this != (CVmMemorySource *)0x0) {
    (*(this->super_CVmDataSource)._vptr_CVmDataSource[1])(this);
  }
  if (lVar12 != 0) {
    curl_slist_free_all(lVar12);
  }
  return iVar4;
}

Assistant:

int OS_HttpClient::request(int opts,
                           const char *host, unsigned short portno,
                           const char *verb, const char *resource,
                           const char *send_headers, size_t send_headers_len,
                           OS_HttpPayload *payload,
                           CVmDataSource *reply, char **headers,
                           char **location, const char *ua)
{
    char *url = 0;                                     /* full resource URL */
    CURL *h = 0;                              /* libcurl transaction handle */
    char *formbuf = 0;          /* application/x-www-form-urlencoded buffer */
    size_t formlen = 0;                           /* length of formbuf data */
    int ret = ErrOther;                                      /* result code */
    curl_httppost *formhead = 0;          /* multipart form field list head */
    curl_httppost *formtail = 0;          /* multipart form field list tail */
    CVmMemorySource *hstream = 0;    /* memory stream for capturing headers */
    curl_slist *hdr_slist = 0;    /* caller's headers, in curl slist format */
    
    /* initially clear the location, if applicable */
    if (location != 0)
        *location = 0;

    /* presume no headers */
    if (headers != 0)
        *headers = 0;

    /* figure the scheme */
    const char *scheme = ((opts & OptHTTPS) != 0 ? "https" : "http");

    /* set up a handle for the communications */
    h = curl_easy_init();

    /* if that failed, return failure */
    if (h == 0)
    {
        ret = ErrOther;
        goto done;
    }

    /* build the full URL */
    url = t3sprintf_alloc("%s://%s:%d%s", scheme, host, portno, resource);

    /* set up the connection to the resource */
    curl_easy_setopt(h, CURLOPT_URL, url);

    /* we don't want a progress meter or signals */
    curl_easy_setopt(h, CURLOPT_NOPROGRESS, (long)1);
    curl_easy_setopt(h, CURLOPT_NOSIGNAL, (long)1);

    /* set our write callback */
    curl_easy_setopt(h, CURLOPT_WRITEFUNCTION, http_get_recv);
    curl_easy_setopt(h, CURLOPT_WRITEDATA, reply);

    /* set our header write callback, if the caller wants the headers */
    if (headers != 0)
    {
        hstream = new CVmMemorySource(1024);
        curl_easy_setopt(h, CURLOPT_HEADERFUNCTION, http_get_hdr);
        curl_easy_setopt(h, CURLOPT_WRITEHEADER, hstream);
    }

    /* if there's a user agent string, send it along */
    if (ua != 0 && ua[0] != '\0')
        curl_easy_setopt(h, CURLOPT_USERAGENT, ua);

    /* set the verb */
    if (stricmp(verb, "GET") == 0)
    {
        /* this is the default verb - no libcurl option setting is needed */
    }
    else if (stricmp(verb, "POST") == 0 && payload != 0)
    {
        /* check for a multipart/formdata upload */
        if (payload->count_items() == 1
            && payload->get(0)->name[0] == '\0')
        {
            /* 
             *   We have exactly one file-type item, and the item has an
             *   empty name.  In this case, the caller has pre-encoded the
             *   content body, so we don't want to apply any further POST
             *   encoding; simply use the content exactly as given. 
             */

            /* get the file to send - this is the payload item's stream */
            CVmDataSource *stream = payload->get(0)->stream;

            /* set up the source data */
            curl_easy_setopt(h, CURLOPT_READFUNCTION, http_get_send);
            curl_easy_setopt(h, CURLOPT_READDATA, stream);
            curl_easy_setopt(h, CURLOPT_INFILESIZE, stream->get_size());
        }
        else if (payload->is_multipart())
        {
            /* we have file attachments - build a curl_httppost list */
            int cnt = payload->count_items();
            for (int i = 0 ; i < cnt ; ++i)
            {
                /* get this item */
                OS_HttpPayloadItem *item = payload->get(i);

                /* check the item type */
                if (item->stream != 0)
                {
                    /* this is a file upload field */
                    if (curl_formadd(
                        &formhead, &formtail,
                        CURLFORM_COPYNAME, item->name,
                        CURLFORM_FILENAME, item->val,
                        CURLFORM_CONTENTTYPE, item->mime_type,
                        CURLFORM_CONTENTSLENGTH, item->stream->get_size(),
                        CURLFORM_STREAM, item->stream,
                        CURLFORM_END))
                        goto done;

                    /* make sure we've set the read callback */
                    curl_easy_setopt(h, CURLOPT_READFUNCTION, http_get_send);
                }
                else
                {
                    /* this is a simple name/value pair */
                    if (curl_formadd(&formhead, &formtail,
                                     CURLFORM_COPYNAME, item->name,
                                     CURLFORM_COPYCONTENTS, item->val,
                                     CURLFORM_END))
                        goto done;
                }
            }

            /* set up the post with the field list */
            curl_easy_setopt(h, CURLOPT_POST, (long)1);
            curl_easy_setopt(h, CURLOPT_HTTPPOST, formhead);
        }
        else
        {
            /* it's a simple form - build the urlencoded form data */
            formbuf = payload->urlencode(formlen);

            /* set the form data */
            curl_easy_setopt(h, CURLOPT_POST, (long)1);
            curl_easy_setopt(h, CURLOPT_POSTFIELDS, formbuf);
            curl_easy_setopt(h, CURLOPT_POSTFIELDSIZE, (long)formlen);
        }
    }
    else if (stricmp(verb, "PUT") == 0
             && payload != 0
             && payload->count_items() == 1)
    {
        /* set the PUT verb */
        curl_easy_setopt(h, CURLOPT_UPLOAD, (long)1);

        /* get the file to send - this is the single payload item's stream */
        CVmDataSource *stream = payload->get(0)->stream;

        /* set up the source data */
        curl_easy_setopt(h, CURLOPT_READFUNCTION, http_get_send);
        curl_easy_setopt(h, CURLOPT_READDATA, stream);
        curl_easy_setopt(h, CURLOPT_INFILESIZE, (long)stream->get_size());
    }
    else 
    {
        /* it's not GET, POST, or PUT - we don't accept other verbs */
        curl_easy_cleanup(h);
        return ErrParams;
    }

    /* 
     *   if a location parameter was provided, the caller wants to get any
     *   redirect location returned, rather than following the redirect;
     *   otherwise they want us to follow redirects 
     */
    curl_easy_setopt(h, CURLOPT_FOLLOWLOCATION, (long)(location == 0));

    /* add the caller's custom headers, if provided */
    if (send_headers != 0)
    {
        /* add each header to the list */
        const char *p = send_headers;
        size_t rem = send_headers_len;
        while (rem != 0)
        {
            /* skip leading spaces */
            for ( ; rem != 0 && *p != '\r' && *p != '\n' && is_space(*p) ;
                 ++p, --rem) ;

            /* scan to the CR-LF */
            const char *h = p;
            for ( ; rem != 0 && !(rem >= 2 && memcmp(p, "\r\n", 2) == 0) ;
                 ++p, --rem) ;

            /* if the line isn't empty, add the header */
            if (p != h)
            {
                /* get a null-terminated copy of the header */
                char *hn = lib_copy_str(h, p - h);

                /* add the header */
                hdr_slist = curl_slist_append(hdr_slist, hn);

                /* done with the copy of the string */
                lib_free_str(hn);
            }

            /* skip the CR-LF */
            if (rem >= 2)
                p += 2, rem -= 2;
        }

        /* set the header list in curl */
        curl_easy_setopt(h, CURLOPT_HTTPHEADER, hdr_slist);
    }

    /* 
     *   To debug problems with CURL, enable the next two lines, which tell
     *   CURL to call curl_debug() with detailed status information as it
     *   goes through the curl_easy_perform() call.  The status information
     *   can be very helpful in tracking down problems.  You can look at the
     *   status calls to curl_debug() using gdb or by modifying curl_debug()
     *   (see above) to write to a log file or the like.
     */
#ifdef OSNU_CURL_DEBUG
    curl_easy_setopt(h, CURLOPT_VERBOSE, 1);
    curl_easy_setopt(h, CURLOPT_DEBUGFUNCTION, curl_debug);
#endif

    /* do the transfer */
    if (!curl_easy_perform(h))
    {
        /* get the HTTP response code */
        long http_stat;
        curl_easy_getinfo(h, CURLINFO_RESPONSE_CODE, &http_stat);

        /* the HTTP response code is the return value */
        ret = (int)http_stat;

        /* if they wanted redirect data, and we got redirect data, return it */
        if (location != 0 && http_stat == 301)
        {
            char *l = 0;
            curl_easy_getinfo(h, CURLINFO_REDIRECT_URL, &l);
            
            /* copy it back to the caller */
            *location = lib_copy_str(l);
        }

        /* if they wanted headers, return the headers */
        if (headers != 0)
        {
            /* get the size of the headers */
            size_t hlen = hstream->get_size();

            /* allocate space for a copy for the caller (with null byte) */
            *headers = new char[hlen + 1];

            /* copy the headers into the new buffer */
            hstream->seek(0, OSFSK_SET);
            hstream->read(*headers, hlen);

            /* add the null terminator */
            (*headers)[hlen] = '\0';
        }
    }

done:
    /* close the handle */
    if (h != 0)
        curl_easy_cleanup(h);

    /* delete the URL buffer */
    if (url != 0)
        lib_free_str(url);

    /* free the form data buffer */
    if (formbuf != 0)
        t3free(formbuf);

    /* delete the multipart form field list */
    if (formhead != 0)
        curl_formfree(formhead);

    /* delete the header capture stream */
    if (hstream != 0)
        delete hstream;

    /* free the header slist */
    if (hdr_slist != 0)
        curl_slist_free_all(hdr_slist);

    /* return the result code */
    return ret;
}